

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift_reduce_parser.cpp
# Opt level: O2

JsonValue * __thiscall MercuryJson::JSON::_shift_reduce_parsing(JSON *this)

{
  char encountered;
  JsonPartialValue *pJVar1;
  long lVar2;
  JsonObject *pJVar3;
  JsonObject *pJVar4;
  JsonValue *pJVar5;
  pointer this_00;
  ulong uVar6;
  size_t sVar7;
  JsonPartialValue **ppJVar8;
  int iVar9;
  long lVar10;
  pointer pPVar11;
  long lVar12;
  thread *this_01;
  bool bVar13;
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  stacks;
  thread shift_reduce_threads [3];
  ParseStack *local_a8;
  size_t *local_a0;
  size_t *local_98;
  JSON *local_90;
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  allocators;
  thread local_70;
  BlockAllocator<MercuryJson::JsonValue> local_68;
  
  shift_reduce_threads[2]._M_id._M_thread = (id)0;
  allocators.
  super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shift_reduce_threads[0]._M_id._M_thread = (id)0;
  shift_reduce_threads[1]._M_id._M_thread = (id)0;
  allocators.
  super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allocators.
  super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ::reserve(&allocators,3);
  stacks.
  super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stacks.
  super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stacks.
  super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ::reserve(&stacks,4);
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
  ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>&>
            ((vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
              *)&stacks,&this->allocator);
  iVar9 = 3;
  while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
    BlockAllocator<MercuryJson::JsonValue>::fork(&local_68);
    std::
    vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>>>
    ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>>
              ((vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>>>
                *)&allocators,&local_68);
    BlockAllocator<MercuryJson::JsonValue>::~BlockAllocator(&local_68);
  }
  for (lVar10 = 0; lVar10 != 0xa8; lVar10 = lVar10 + 0x38) {
    std::
    vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
    ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>&>
              ((vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
                *)&stacks,
               (BlockAllocator<MercuryJson::JsonValue> *)
               ((long)&(allocators.
                        super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptr + lVar10));
  }
  this_01 = shift_reduce_threads;
  lVar12 = 2;
  for (lVar10 = 0x18; uVar6 = this->num_indices - 1, lVar10 != 0x60; lVar10 = lVar10 + 0x18) {
    local_68.ptr = (char *)_thread_shift_reduce_parsing;
    local_68.all_memory.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8 = (ParseStack *)
               ((long)&(stacks.
                        super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
                        ._M_impl.super__Vector_impl_data._M_start)->stack + lVar10);
    local_a0 = this->indices + (uVar6 * lVar12 >> 2);
    local_98 = this->indices + ((lVar12 + -1) * uVar6 >> 2);
    local_90 = this;
    std::thread::
    thread<void(MercuryJson::JSON::*)(unsigned_long_const*,unsigned_long_const*,MercuryJson::shift_reduce_impl::ParseStack*),MercuryJson::JSON*,unsigned_long*,unsigned_long*,MercuryJson::shift_reduce_impl::ParseStack*,void>
              (&local_70,(type *)&local_68,&local_90,&local_98,&local_a0,&local_a8);
    std::thread::operator=(this_01,&local_70);
    std::thread::~thread(&local_70);
    this_01 = this_01 + 1;
    lVar12 = lVar12 + 1;
  }
  _thread_shift_reduce_parsing
            (this,this->indices,this->indices + (uVar6 >> 2),
             stacks.
             super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
             ._M_impl.super__Vector_impl_data._M_start);
  this_00 = stacks.
            super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = 0;
  do {
    if (lVar10 == 3) {
      if (this_00->stack_top != 1) {
        __assert_fail("main_stack.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Somefive[P]MercuryJson/src/shift_reduce_parser.cpp"
                      ,0x208,"JsonValue *MercuryJson::JSON::_shift_reduce_parsing()");
      }
      pJVar5 = (JsonValue *)*this_00->stack;
      this->idx_ptr = this->idx_ptr + (this->num_indices - 1);
      std::
      vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
      ::~vector(&stacks);
      std::
      vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
      ::~vector(&allocators);
      lVar10 = 0x10;
      do {
        std::thread::~thread((thread *)((long)&shift_reduce_threads[0]._M_id._M_thread + lVar10));
        lVar10 = lVar10 + -8;
      } while (lVar10 != -8);
      return pJVar5;
    }
    std::thread::join();
    lVar10 = lVar10 + 1;
    pPVar11 = stacks.
              super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar10;
    for (uVar6 = 0; uVar6 < pPVar11->stack_top; uVar6 = uVar6 + 1) {
      pJVar1 = pPVar11->stack[uVar6];
      switch(pJVar1->type) {
      case TYPE_NULL:
      case TYPE_BOOL:
      case TYPE_STR:
      case TYPE_OBJ:
      case TYPE_ARR:
      case TYPE_INT:
      case TYPE_DEC:
        sVar7 = this_00->stack_top;
        this_00->stack_top = sVar7 + 1;
        this_00->stack[sVar7] = pJVar1;
        break;
      case TYPE_PARTIAL_OBJ:
        bVar13 = shift_reduce_impl::ParseStack::
                 check<MercuryJson::shift_reduce_impl::JsonPartialValue::ValueType,char>
                           (this_00,TYPE_PARTIAL_OBJ,',');
        ppJVar8 = this_00->stack;
        sVar7 = this_00->stack_top;
        if (!bVar13) goto LAB_00112e86;
        lVar12 = (pJVar1->field_1).integer;
        lVar2 = (ppJVar8[sVar7 - 2]->field_1).integer;
        *(long *)(*(long *)(lVar2 + 0x18) + 0x10) = lVar12;
        *(undefined8 *)(lVar2 + 0x18) = *(undefined8 *)(lVar12 + 0x18);
LAB_00112e7a:
        this_00->stack_top = sVar7 - 1;
        break;
      case TYPE_PARTIAL_ARR:
        bVar13 = shift_reduce_impl::ParseStack::
                 check<MercuryJson::shift_reduce_impl::JsonPartialValue::ValueType,char>
                           (this_00,TYPE_PARTIAL_ARR,',');
        ppJVar8 = this_00->stack;
        sVar7 = this_00->stack_top;
        if (bVar13) {
          pJVar3 = (pJVar1->field_1).object;
          pJVar4 = (ppJVar8[sVar7 - 2]->field_1).object;
          pJVar4->next->value = (JsonValue *)pJVar3;
          pJVar4->next = pJVar3->next;
          goto LAB_00112e7a;
        }
LAB_00112e86:
        this_00->stack_top = sVar7 + 1;
        ppJVar8[sVar7] = pJVar1;
        break;
      case TYPE_CHAR:
        encountered = (pJVar1->field_1).structural;
        if (encountered == ',') {
          shift_reduce_impl::ParseStack::reduce_partial_array(this_00);
        }
        else if ((encountered == ':') || (encountered == '[')) {
LAB_00112e00:
          shift_reduce_impl::ParseStack::push<char>(this_00,encountered);
        }
        else if (encountered == ']') {
          shift_reduce_impl::ParseStack::reduce_array(this_00);
        }
        else {
          if (encountered != '}') {
            if (encountered != '{') {
              _error(this,"JSON value",encountered,uVar6);
            }
            goto LAB_00112e00;
          }
          shift_reduce_impl::ParseStack::reduce_object(this_00);
        }
      }
      do {
        bVar13 = shift_reduce_impl::ParseStack::reduce_partial_object(this_00);
      } while (bVar13);
    }
  } while( true );
}

Assistant:

JsonValue *JSON::_shift_reduce_parsing() {
        using shift_reduce_impl::JsonPartialValue;
        using shift_reduce_impl::JsonPartialObjectHead;
        using shift_reduce_impl::JsonPartialArrayHead;
        using shift_reduce_impl::ParseStack;

#if SHIFT_REDUCE_NUM_THREADS > 1
        std::thread shift_reduce_threads[SHIFT_REDUCE_NUM_THREADS - 1];
        std::vector<BlockAllocator<JsonValue>> allocators;
        allocators.reserve(SHIFT_REDUCE_NUM_THREADS - 1);
        std::vector<ParseStack> stacks;
        stacks.reserve(SHIFT_REDUCE_NUM_THREADS);
        stacks.emplace_back(allocator);
        size_t num_indices_per_thread = (num_indices - 1 + SHIFT_REDUCE_NUM_THREADS) / SHIFT_REDUCE_NUM_THREADS;
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i)
            allocators.push_back(allocator.fork(2 * num_indices_per_thread * sizeof(JsonPartialValue)));
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i)
            stacks.emplace_back(allocators[i]);
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i) {
            size_t idx_begin = (num_indices - 1) * (i + 1) / SHIFT_REDUCE_NUM_THREADS;
            size_t idx_end = (num_indices - 1) * (i + 2) / SHIFT_REDUCE_NUM_THREADS;
            shift_reduce_threads[i] = std::thread(&JSON::_thread_shift_reduce_parsing, this,
                                                  indices + idx_begin, indices + idx_end, &stacks[i + 1]);
        }
        size_t idx_end = (num_indices - 1) / SHIFT_REDUCE_NUM_THREADS;
        _thread_shift_reduce_parsing(indices, indices + idx_end, &stacks[0]);

        // Join threads and merge.
        ParseStack &main_stack = stacks[0];
//        main_stack.print();
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i) {
            shift_reduce_threads[i].join();
            ParseStack &merge_stack = stacks[i + 1];
//            merge_stack.print();
            for (size_t idx = 0; idx < merge_stack.size(); ++idx) {
                auto *value = merge_stack[idx];
                switch (value->type) {
                    case JsonPartialValue::TYPE_NULL:
                    case JsonPartialValue::TYPE_BOOL:
                    case JsonPartialValue::TYPE_STR:
                    case JsonPartialValue::TYPE_OBJ:
                    case JsonPartialValue::TYPE_ARR:
                    case JsonPartialValue::TYPE_INT:
                    case JsonPartialValue::TYPE_DEC:
                        main_stack.push(value);
                        break;
                    case JsonPartialValue::TYPE_PARTIAL_OBJ:
                        if (main_stack.check(JsonPartialValue::TYPE_PARTIAL_OBJ, ',')) {
                            // Merge with partial object from previous stack.
                            auto *prev_obj = static_cast<JsonPartialObjectHead *>(main_stack.get(2)->partial_object);
                            prev_obj->final->next = value->partial_object;
                            prev_obj->final = static_cast<JsonPartialObjectHead *>(value->partial_object)->final;
                            main_stack.pop(1);
                        } else {
                            main_stack.push(value);
                        }
                        break;
                    case JsonPartialValue::TYPE_PARTIAL_ARR:
                        if (main_stack.check(JsonPartialValue::TYPE_PARTIAL_ARR, ',')) {
                            // Merge with partial array from previous stack.
                            auto *prev_arr = static_cast<JsonPartialArrayHead *>(main_stack.get(2)->partial_array);
                            prev_arr->final->next = value->partial_array;
                            prev_arr->final = static_cast<JsonPartialArrayHead *>(value->partial_array)->final;
                            main_stack.pop(1);
                        } else {
                            main_stack.push(value);
                        }
                        break;
                    case JsonPartialValue::TYPE_CHAR:
                        switch (char ch = value->structural) {
                            case '{':
                            case '[':
                            case ':':
                                main_stack.push(ch);
                                break;

                                // Perform reduce on the stack.
                                // There will be at most two consecutive reduce ops:
                                //   1. From a partial array to array, or from a partial object to object.
                                //   2. Merge the previously constructed value with a partial array or partial object.
                            case '}':
                                // "{", partial-object, "}"  =>  object
                                main_stack.reduce_object();
                                break;
                            case ']':
                                // "[", partial-array, "]"  =>  array
                                main_stack.reduce_array();
                                break;
                            case ',':
                                // value, ","  =>  partial-array
                                main_stack.reduce_partial_array();
                                break;
                            default:
                                error("JSON value");
                        }
                        break;
                }
                while (main_stack.reduce_partial_object()) {}
            }
        }
#else
        ParseStack main_stack(allocator);
        _thread_shift_reduce_parsing(indices, indices + num_indices - 1, &main_stack);
#endif
//        main_stack.print();
        assert(main_stack.size() == 1);
        auto *ret = reinterpret_cast<JsonValue *>(main_stack[0]);
        idx_ptr += num_indices - 1;  // Consume the indices to satisfy null ending check.

        return ret;
    }